

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O0

void __thiscall GEO::ProgressTask::~ProgressTask(ProgressTask *this)

{
  ProgressTask *this_local;
  
  ~ProgressTask(this);
  operator_delete(this);
  return;
}

Assistant:

ProgressTask::~ProgressTask() {
        if(!quiet_) {
            end_task(this);
        }
    }